

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::handleDefaultNetTypeDirective(Preprocessor *this,Token directive)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  undefined8 uVar1;
  bool bVar2;
  DefaultNetTypeDirectiveSyntax *syntax;
  long in_RDI;
  Token TVar3;
  DefaultNetTypeDirectiveSyntax *result;
  SourceLocation loc;
  Token netType;
  TokenKind in_stack_000001c6;
  BumpAllocator *in_stack_000001c8;
  SourceLocation in_stack_000001d0;
  undefined6 in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff06;
  TokenKind TVar4;
  SourceLocation in_stack_ffffffffffffff08;
  Preprocessor *in_stack_ffffffffffffff10;
  DiagCode code;
  Token in_stack_ffffffffffffff18;
  Token *args_1;
  SourceLocation in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  string_view local_c8;
  SourceLocation local_b8;
  SourceLocation local_b0;
  Token local_a8;
  Token local_88;
  string_view local_78;
  Token local_68;
  Token local_58;
  undefined8 local_48;
  Token *local_40;
  Token local_20;
  Trivia local_10;
  
  checkOutsideDesignElement(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  Token::Token((Token *)CONCAT26(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00));
  local_58 = peek((Preprocessor *)in_stack_ffffffffffffff08);
  args_1 = (Token *)in_stack_ffffffffffffff18.info;
  TVar4 = local_58.kind;
  if (local_58.kind == Identifier) {
    local_88 = peek((Preprocessor *)in_stack_ffffffffffffff08);
    local_78 = Token::rawText((Token *)in_stack_ffffffffffffff10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff10,
               (char *)in_stack_ffffffffffffff08);
    args_1 = (Token *)in_stack_ffffffffffffff18.info;
    __x._M_str._0_4_ = in_stack_ffffffffffffff30;
    __x._M_len = (size_t)in_stack_ffffffffffffff28;
    __x._M_str._4_4_ = in_stack_ffffffffffffff34;
    bVar2 = std::operator==(__x,(__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                                in_stack_ffffffffffffff18);
    if (bVar2) {
      TVar3 = consume(in_stack_ffffffffffffff10);
      local_a8._0_8_ = TVar3._0_8_;
      local_48._0_2_ = local_a8.kind;
      local_48._2_1_ = local_a8._2_1_;
      local_48._3_1_ = local_a8.numFlags.raw;
      local_48._4_4_ = local_a8.rawLen;
      local_a8.info = TVar3.info;
      local_40 = (Token *)local_a8.info;
      *(undefined2 *)(in_RDI + 0x286) = 0;
      local_a8 = TVar3;
    }
  }
  else if (((((ushort)(local_58.kind - TriKeyword) < 6) || (local_58.kind == UWireKeyword)) ||
           (local_58.kind == WAndKeyword)) ||
          ((local_58.kind == WireKeyword || (local_58.kind == WOrKeyword)))) {
    TVar3 = consume(in_stack_ffffffffffffff10);
    local_68._0_8_ = TVar3._0_8_;
    local_48._0_2_ = local_68.kind;
    local_48._2_1_ = local_68._2_1_;
    local_48._3_1_ = local_68.numFlags.raw;
    local_48._4_4_ = local_68.rawLen;
    uVar1 = local_48;
    local_68.info = TVar3.info;
    local_40 = (Token *)local_68.info;
    local_48._0_2_ = TVar3.kind;
    *(TokenKind *)(in_RDI + 0x286) = (TokenKind)local_48;
    local_68 = TVar3;
    local_48 = uVar1;
  }
  bVar2 = Token::operator_cast_to_bool((Token *)0x36a9da);
  if (!bVar2) {
    local_b8 = Token::location(&local_20);
    local_c8 = Token::rawText((Token *)in_stack_ffffffffffffff10);
    code = SUB84((ulong)in_stack_ffffffffffffff10 >> 0x20,0);
    std::basic_string_view<char,_std::char_traits<char>_>::length(&local_c8);
    in_stack_ffffffffffffff28 =
         SourceLocation::operator+<unsigned_long>
                   ((SourceLocation *)in_stack_ffffffffffffff08,
                    CONCAT26(TVar4,in_stack_ffffffffffffff00));
    in_stack_ffffffffffffff34 = 0x70004;
    local_b0 = in_stack_ffffffffffffff28;
    addDiag((Preprocessor *)CONCAT26(TVar4,in_stack_ffffffffffffff00),code,in_stack_ffffffffffffff08
           );
    TVar3 = Token::createMissing(in_stack_000001c8,in_stack_000001c6,in_stack_000001d0);
    local_48 = TVar3._0_8_;
    local_40 = (Token *)TVar3.info;
    args_1 = local_40;
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::DefaultNetTypeDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     ((BumpAllocator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                      ,(Token *)in_stack_ffffffffffffff28,args_1);
  Trivia::Trivia(&local_10,Directive,(SyntaxNode *)syntax);
  return local_10;
}

Assistant:

Trivia Preprocessor::handleDefaultNetTypeDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token netType;
    switch (peek().kind) {
        case TokenKind::WireKeyword:
        case TokenKind::UWireKeyword:
        case TokenKind::WAndKeyword:
        case TokenKind::WOrKeyword:
        case TokenKind::TriKeyword:
        case TokenKind::Tri0Keyword:
        case TokenKind::Tri1Keyword:
        case TokenKind::TriAndKeyword:
        case TokenKind::TriOrKeyword:
        case TokenKind::TriRegKeyword:
            netType = consume();
            defaultNetType = netType.kind;
            break;
        case TokenKind::Identifier:
            // none isn't a keyword but it's special here
            if (peek().rawText() == "none") {
                netType = consume();
                defaultNetType = TokenKind::Unknown;
            }
            break;
        default:
            break;
    }

    if (!netType) {
        auto loc = directive.location() + directive.rawText().length();
        addDiag(diag::ExpectedNetType, loc);
        netType = Token::createMissing(alloc, TokenKind::WireKeyword, loc);
    }

    auto result = alloc.emplace<DefaultNetTypeDirectiveSyntax>(directive, netType);
    return Trivia(TriviaKind::Directive, result);
}